

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O3

void __thiscall QEvdevTabletData::processInputEvent(QEvdevTabletData *this,input_event *ev)

{
  ushort uVar1;
  __u16 _Var2;
  uint uVar3;
  int iVar4;
  
  uVar3 = (uint)ev->type;
  if (ev->type == 0) {
    uVar3 = 0;
    if ((ev->code == 0) && (this->lastEventType != 0)) {
      report(this);
      uVar3 = (uint)ev->type;
    }
  }
  else if (uVar3 == 1) {
    _Var2 = ev->code;
    uVar3 = 1;
    if (_Var2 == 0x140) {
      iVar4 = (uint)(ev->value != 0) << 2;
    }
    else {
      if (_Var2 != 0x141) {
        if (_Var2 == 0x14a) {
          (this->state).down = ev->value != 0;
        }
        goto LAB_00107eaa;
      }
      iVar4 = (uint)(ev->value != 0) << 3;
    }
    (this->state).tool = iVar4;
  }
  else if (uVar3 == 3) {
    uVar1 = ev->code;
    uVar3 = 3;
    if (uVar1 < 0x18) {
      if (uVar1 == 0) {
        (this->state).x = ev->value;
      }
      else if (uVar1 == 1) {
        (this->state).y = ev->value;
      }
    }
    else if (uVar1 == 0x18) {
      (this->state).p = ev->value;
    }
    else if (uVar1 == 0x19) {
      (this->state).d = ev->value;
    }
  }
LAB_00107eaa:
  this->lastEventType = uVar3;
  return;
}

Assistant:

void QEvdevTabletData::processInputEvent(input_event *ev)
{
    if (ev->type == EV_ABS) {
        switch (ev->code) {
        case ABS_X:
            state.x = ev->value;
            break;
        case ABS_Y:
            state.y = ev->value;
            break;
        case ABS_PRESSURE:
            state.p = ev->value;
            break;
        case ABS_DISTANCE:
            state.d = ev->value;
            break;
        default:
            break;
        }
    } else if (ev->type == EV_KEY) {
        // code BTN_TOOL_* value 1 -> proximity enter
        // code BTN_TOOL_* value 0 -> proximity leave
        // code BTN_TOUCH value 1 -> contact with screen
        // code BTN_TOUCH value 0 -> no contact
        switch (ev->code) {
        case BTN_TOUCH:
            state.down = ev->value != 0;
            break;
        case BTN_TOOL_PEN:
            state.tool = ev->value ? int(QPointingDevice::PointerType::Pen) : 0;
            break;
        case BTN_TOOL_RUBBER:
            state.tool = ev->value ? int(QPointingDevice::PointerType::Eraser) : 0;
            break;
        default:
            break;
        }
    } else if (ev->type == EV_SYN && ev->code == SYN_REPORT && lastEventType != ev->type) {
        report();
    }
    lastEventType = ev->type;
}